

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

Class * __thiscall cppgenerate::Class::getFullyQualifiedName_abi_cxx11_(Class *this)

{
  ulong uVar1;
  string *in_RSI;
  Class *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)this);
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)this,in_RSI + 0x20);
    std::__cxx11::string::operator+=((string *)this,"::");
  }
  std::__cxx11::string::operator+=((string *)this,in_RSI);
  return this;
}

Assistant:

std::string Class::getFullyQualifiedName() const{
    std::string ret;

    if( m_namespace.size() > 1 ){
        ret += m_namespace;
        ret += "::";
    }
    ret += m_className;

    return ret;
}